

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

void __thiscall CLI::App::exit(App *this,int __status)

{
  long lVar1;
  ostream *in_RCX;
  ostream *in_RDX;
  undefined4 in_register_00000034;
  Error *pEVar2;
  string local_70;
  string local_50;
  App *local_30;
  
  pEVar2 = (Error *)CONCAT44(in_register_00000034,__status);
  lVar1 = __dynamic_cast(pEVar2,&Error::typeinfo,&RuntimeError::typeinfo,0);
  if (lVar1 == 0) {
    lVar1 = __dynamic_cast(pEVar2,&Error::typeinfo,&CallForHelp::typeinfo,0);
    if (lVar1 == 0) {
      if ((pEVar2->exit_code != 0) &&
         ((this->failure_message_).super__Function_base._M_manager != (_Manager_type)0x0)) {
        local_30 = this;
        (*(this->failure_message_)._M_invoker)
                  (&local_70,(_Any_data *)&this->failure_message_,&local_30,pEVar2);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (in_RCX,local_70._M_dataplus._M_p,local_70._M_string_length);
        ::std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      help(&local_70,this,0x1e,&local_50);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (in_RDX,local_70._M_dataplus._M_p,local_70._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

int exit(const Error &e, std::ostream &out = std::cout, std::ostream &err = std::cerr) const {

        /// Avoid printing anything if this is a CLI::RuntimeError
        if(dynamic_cast<const CLI::RuntimeError *>(&e) != nullptr)
            return e.get_exit_code();

        if(dynamic_cast<const CLI::CallForHelp *>(&e) != nullptr) {
            out << help();
            return e.get_exit_code();
        }

        if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
            if(failure_message_)
                err << failure_message_(this, e) << std::flush;
        }

        return e.get_exit_code();
    }